

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O3

void __thiscall
soul::CompileMessageList::addWarning(CompileMessageList *this,string *desc,CodeLocation *location)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  value_type local_58;
  
  paVar1 = &local_58.description.field_2;
  pcVar2 = (desc->_M_dataplus)._M_p;
  local_58.description._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + desc->_M_string_length);
  local_58.location.sourceCode.object = (location->sourceCode).object;
  if (local_58.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_58.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_58.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_58.location.location.data = (location->location).data;
  local_58.type = warning;
  local_58.category = none;
  std::vector<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>::push_back
            (&this->messages,&local_58);
  if ((this->onMessage).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->onMessage)._M_invoker)((_Any_data *)this,&local_58);
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_58.location.sourceCode.object);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.description._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.description._M_dataplus._M_p,
                    local_58.description.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CompileMessageList::addWarning (const std::string& desc, CodeLocation location)
{
    add ({ desc, location, CompileMessage::Type::warning });
}